

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int ncnn::set_cpu_thread_affinity(size_t thread_affinity_mask)

{
  return -1;
}

Assistant:

int set_cpu_thread_affinity(size_t thread_affinity_mask)
{
#ifdef __ANDROID__
    int num_threads = 0;
    for (int i=0; i<(int)sizeof(size_t) * 8; i++)
    {
        if (thread_affinity_mask & (1 << i))
            num_threads++;
    }

#ifdef _OPENMP
    // set affinity for each thread
    set_omp_num_threads(num_threads);
    std::vector<int> ssarets(num_threads, 0);
    #pragma omp parallel for num_threads(num_threads)
    for (int i=0; i<num_threads; i++)
    {
        ssarets[i] = set_sched_affinity(thread_affinity_mask);
    }
    for (int i=0; i<num_threads; i++)
    {
        if (ssarets[i] != 0)
            return -1;
    }
#else
    int ssaret = set_sched_affinity(thread_affinity_mask);
    if (ssaret != 0)
        return -1;
#endif

    return 0;
#elif __IOS__
    // thread affinity not supported on ios
    (void)thread_affinity_mask;
    return -1;
#else
    // TODO
    (void)thread_affinity_mask;
    return -1;
#endif
}